

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSystem.cpp
# Opt level: O1

ChVector<double> * __thiscall
chrono::ChSystem::GetBodyAppliedTorque
          (ChVector<double> *__return_storage_ptr__,ChSystem *this,ChBody *body)

{
  ChVectorDynamic<> *this_00;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  ActualDstType actualDst;
  double *local_58;
  undefined8 local_50;
  ChVectorDynamic<> *local_40;
  long local_38;
  long local_28;
  
  if (this->is_initialized == false) {
    __return_storage_ptr__->m_data[0] = 0.0;
    __return_storage_ptr__->m_data[1] = 0.0;
    __return_storage_ptr__->m_data[2] = 0.0;
  }
  else {
    if (this->applied_forces_current == false) {
      this_00 = &this->applied_forces;
      iVar1 = (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x13])(this)
      ;
      Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                (&this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,
                 (long)iVar1);
      lVar2 = (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows;
      if (lVar2 < 0) {
        __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                      ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                      "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                     );
      }
      if (lVar2 != 0) {
        memset((this_00->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
               m_data,0,lVar2 << 3);
      }
      (*(this->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0xe])
                (0x3ff0000000000000,this,this_00);
      this->applied_forces_current = true;
    }
    iVar1 = (*(body->super_ChPhysicsItem).super_ChObj._vptr_ChObj[0x3c])(body);
    lVar2 = (long)*(int *)(CONCAT44(extraout_var,iVar1) + 0x30);
    local_38 = lVar2 + 3;
    local_58 = (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_data + lVar2 + 3;
    local_28 = (this->applied_forces).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
               .m_storage.m_rows;
    local_50 = 3;
    local_40 = &this->applied_forces;
    if ((lVar2 < -3) || (local_28 + -3 < local_38)) {
      __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                    ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                    "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                   );
    }
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (__return_storage_ptr__,
               (MatrixBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_58,(type *)0x0);
  }
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChSystem::GetBodyAppliedTorque(ChBody* body) {
    if (!is_initialized)
        return ChVector<>(0, 0, 0);

    if (!applied_forces_current) {
        applied_forces.setZero(this->GetNcoords_v());
        LoadResidual_F(applied_forces, 1.0);
        applied_forces_current = true;
    }
    return applied_forces.segment(body->Variables().GetOffset() + 3, 3);
}